

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecompressSettings *zlibsettings,uchar *data,
                   size_t chunkLength)

{
  uint uVar1;
  bool bVar2;
  undefined1 local_58 [8];
  ucvector decoded;
  char *key;
  uint string2_begin;
  uint length;
  uint i;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGDecompressSettings *zlibsettings_local;
  LodePNGInfo *info_local;
  
  decoded.allocsize = 0;
  ucvector_init((ucvector *)local_58);
  key._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (key._4_4_ < chunkLength) {
      bVar2 = data[key._4_4_] != '\0';
    }
    if (!bVar2) break;
    key._4_4_ = key._4_4_ + 1;
  }
  if (key._4_4_ + 2 < chunkLength) {
    if ((key._4_4_ == 0) || (0x4f < key._4_4_)) {
      length = 0x59;
    }
    else {
      decoded.allocsize = (size_t)lodepng_malloc((ulong)(key._4_4_ + 1));
      if ((void *)decoded.allocsize == (void *)0x0) {
        length = 0x53;
      }
      else {
        *(undefined1 *)(decoded.allocsize + key._4_4_) = 0;
        for (string2_begin = 0; string2_begin != key._4_4_; string2_begin = string2_begin + 1) {
          *(uchar *)(decoded.allocsize + string2_begin) = data[string2_begin];
        }
        if (data[key._4_4_ + 1] == '\0') {
          uVar1 = key._4_4_ + 2;
          if (chunkLength < uVar1) {
            length = 0x4b;
          }
          else {
            length = zlib_decompress((uchar **)local_58,(size_t *)&decoded,data + uVar1,
                                     (ulong)((int)chunkLength - uVar1),zlibsettings);
            if (length == 0) {
              ucvector_push_back((ucvector *)local_58,'\0');
              length = lodepng_add_text(info,(char *)decoded.allocsize,(char *)local_58);
            }
          }
        }
        else {
          length = 0x48;
        }
      }
    }
  }
  else {
    length = 0x4b;
  }
  lodepng_free((void *)decoded.allocsize);
  ucvector_cleanup(local_58);
  return length;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecompressSettings* zlibsettings,
                               const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  unsigned i;

  unsigned length, string2_begin;
  char *key = 0;
  ucvector decoded;

  ucvector_init(&decoded);

  while(!error) /*not really a while loop, only used to break on error*/
  {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = chunkLength - string2_begin;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&decoded.data, &decoded.size,
                            (unsigned char*)(&data[string2_begin]),
                            length, zlibsettings);
    if(error) break;
    ucvector_push_back(&decoded, 0);

    error = lodepng_add_text(info, key, (char*)decoded.data);

    break;
  }

  lodepng_free(key);
  ucvector_cleanup(&decoded);

  return error;
}